

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::FieldOptions>
          (Tables *this,FieldOptions *param_1)

{
  FieldOptions *this_00;
  FieldOptions *result;
  
  this_00 = (FieldOptions *)operator_new(0x58);
  FieldOptions::FieldOptions(this_00);
  result = this_00;
  std::
  vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
  ::emplace_back<google::protobuf::FieldOptions*&>
            ((vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
              *)&this->messages_,&result);
  return result;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}